

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

void decorr_mono_pass(decorr_pass *dpp,int32_t *buffer,int32_t sample_count)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int in_EDX;
  uint *in_RSI;
  short *in_RDI;
  long in_FS_OFFSET;
  int k;
  int m;
  int32_t sam_A;
  int32_t *eptr;
  int32_t *bptr;
  int32_t weight_A;
  int32_t delta;
  int32_t temp_samples [8];
  int local_80;
  int local_78;
  int local_70;
  uint local_64;
  uint local_60;
  uint *local_50;
  int local_44;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (int)in_RDI[1];
  local_44 = (int)in_RDI[2];
  puVar1 = in_RSI + in_EDX;
  local_50 = in_RSI;
  if (*in_RDI == 0x11) {
    for (; local_50 < puVar1; local_50 = local_50 + 1) {
      uVar3 = *(int *)(in_RDI + 4) * 2 - *(int *)(in_RDI + 6);
      *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RDI + 4);
      if (uVar3 == (int)(short)uVar3) {
        local_70 = (int)(local_44 * uVar3 + 0x200) >> 10;
      }
      else {
        local_70 = (int)(((long)(((long)(int)uVar3 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar3 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 4) = local_70 + *local_50;
      if ((uVar3 != 0) && (*local_50 != 0)) {
        local_44 = ((int)(uVar3 ^ *local_50) >> 0x1e | 1U) * iVar2 + local_44;
      }
      *local_50 = *(uint *)(in_RDI + 4);
    }
  }
  else if (*in_RDI == 0x12) {
    for (; local_50 < puVar1; local_50 = local_50 + 1) {
      uVar3 = *(int *)(in_RDI + 4) * 3 - *(int *)(in_RDI + 6) >> 1;
      *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RDI + 4);
      if (uVar3 == (int)(short)uVar3) {
        local_78 = (int)(local_44 * uVar3 + 0x200) >> 10;
      }
      else {
        local_78 = (int)(((long)(((long)(int)uVar3 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar3 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 4) = local_78 + *local_50;
      if ((uVar3 != 0) && (*local_50 != 0)) {
        local_44 = ((int)(uVar3 ^ *local_50) >> 0x1e | 1U) * iVar2 + local_44;
      }
      *local_50 = *(uint *)(in_RDI + 4);
    }
  }
  else {
    local_60 = 0;
    local_64 = (uint)*in_RDI;
    for (; local_64 = local_64 & 7, local_50 < puVar1; local_50 = local_50 + 1) {
      uVar3 = *(uint *)(in_RDI + (long)(int)local_60 * 2 + 4);
      if (uVar3 == (int)(short)uVar3) {
        local_80 = (int)(local_44 * uVar3 + 0x200) >> 10;
      }
      else {
        local_80 = (int)(((long)(((long)(int)uVar3 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar3 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + (long)(int)local_64 * 2 + 4) = local_80 + *local_50;
      if ((uVar3 != 0) && (*local_50 != 0)) {
        local_44 = ((int)(uVar3 ^ *local_50) >> 0x1e | 1U) * iVar2 + local_44;
      }
      *local_50 = *(uint *)(in_RDI + (long)(int)local_64 * 2 + 4);
      local_60 = local_60 + 1 & 7;
      local_64 = local_64 + 1;
    }
    if (local_60 != 0) {
      local_28 = *(undefined8 *)(in_RDI + 4);
      local_20 = *(undefined8 *)(in_RDI + 8);
      local_18 = *(undefined8 *)(in_RDI + 0xc);
      local_10 = *(undefined8 *)(in_RDI + 0x10);
      for (local_64 = 0; (int)local_64 < 8; local_64 = local_64 + 1) {
        *(undefined4 *)(in_RDI + (long)(int)local_64 * 2 + 4) =
             *(undefined4 *)((long)&local_28 + (long)(int)(local_60 & 7) * 4);
        local_60 = local_60 + 1;
      }
    }
  }
  in_RDI[2] = (short)local_44;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void decorr_mono_pass (struct decorr_pass *dpp, int32_t *buffer, int32_t sample_count)
{
    int32_t delta = dpp->delta, weight_A = dpp->weight_A;
    int32_t *bptr, *eptr = buffer + sample_count, sam_A;
    int m, k;

    switch (dpp->term) {

        case 17:
            for (bptr = buffer; bptr < eptr; bptr++) {
                sam_A = 2 * dpp->samples_A [0] - dpp->samples_A [1];
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];
            }

            break;

        case 18:
            for (bptr = buffer; bptr < eptr; bptr++) {
                sam_A = (3 * dpp->samples_A [0] - dpp->samples_A [1]) >> 1;
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];
            }

            break;

        default:
            for (m = 0, k = dpp->term & (MAX_TERM - 1), bptr = buffer; bptr < eptr; bptr++) {
                sam_A = dpp->samples_A [m];
                dpp->samples_A [k] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [k];
                m = (m + 1) & (MAX_TERM - 1);
                k = (k + 1) & (MAX_TERM - 1);
            }

            if (m) {
                int32_t temp_samples [MAX_TERM];

                memcpy (temp_samples, dpp->samples_A, sizeof (dpp->samples_A));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_A [k] = temp_samples [m & (MAX_TERM - 1)];
            }

            break;
    }

    dpp->weight_A = weight_A;
}